

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_33c8f::ParseBuildFileDelegate::cannotLoadDueToMultipleProducers
          (ParseBuildFileDelegate *this,Node *output,
          vector<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
          *commands)

{
  Command *pCVar1;
  string message;
  StringRef local_110;
  StringRef local_100;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_100.Data = (output->name)._M_dataplus._M_p;
  local_100.Length = (output->name)._M_string_length;
  llvm::StringRef::str_abi_cxx11_(&local_f0,&local_100);
  std::operator+(&local_70,"cannot build \'",&local_f0);
  std::operator+(&local_d0,&local_70,"\' node is produced by multiple commands; e.g. \'");
  pCVar1 = *(commands->
            super__Vector_base<llbuild::buildsystem::Command_*,_std::allocator<llbuild::buildsystem::Command_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_110.Data = (pCVar1->name)._M_dataplus._M_p;
  local_110.Length = (pCVar1->name)._M_string_length;
  llvm::StringRef::str_abi_cxx11_(&local_90,&local_110);
  std::operator+(&local_b0,&local_d0,&local_90);
  std::operator+(&local_50,&local_b0,"\'");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  local_d0._M_dataplus._M_p = (pointer)0x0;
  local_d0._M_string_length._0_4_ = 0;
  llvm::Twine::Twine((Twine *)&local_b0,&local_50);
  (*(this->super_BuildFileDelegate)._vptr_BuildFileDelegate[5])(this,"",0,&local_d0,&local_b0);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void
ParseBuildFileDelegate::cannotLoadDueToMultipleProducers(Node *output,
                                                         std::vector<Command*> commands) {
  std::string message = "cannot build '" + output->getName().str() + "' node is produced "
  "by multiple commands; e.g. '" + (*commands.begin())->getName().str() + "'";
  error("", {}, message);
}